

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::Bloaty::ScanAndRollupFile
          (Bloaty *this,string *filename,Rollup *rollup,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_build_ids)

{
  _Rb_tree_header *p_Var1;
  DataSource DVar2;
  InputFile *pIVar3;
  _Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_> _Var4;
  Arena *pAVar5;
  RangeSink *pRVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  Bloaty *filename_00;
  pointer pcVar9;
  Rep *pRVar10;
  DualMap *map;
  const_iterator cVar11;
  Arena *pAVar12;
  uint64_t uVar13;
  const_iterator cVar14;
  Rollup *pRVar15;
  pointer *__ptr;
  pointer __old_p;
  MessageLite MVar16;
  string_view name;
  unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> file;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> sourcemap_file;
  string build_id;
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  sinks;
  DualMaps maps;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> filename_sink_ptrs;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> sink_ptrs;
  NameMunger empty_munger;
  undefined1 local_148 [24];
  key_type local_130;
  Arena *local_110;
  Rollup *local_108;
  Arena *local_100;
  Arena *local_f8;
  Rep *local_f0;
  Bloaty *local_e8;
  Arena *local_e0;
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  local_d8;
  DualMaps local_c0;
  Arena *local_a8;
  Arena *pAStack_a0;
  ArenaStringPtr local_98;
  ArenaStringPtr local_88;
  undefined8 uStack_80;
  uint64 local_78;
  string *local_70;
  string local_68;
  NameMunger local_48;
  
  local_110 = (Arena *)out_build_ids;
  local_108 = rollup;
  local_70 = filename;
  GetObjectFile((Bloaty *)local_148,(string *)this);
  DualMaps::DualMaps(&local_c0);
  local_d8.
  super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = 0;
  local_88.ptr_ = (string *)0x0;
  uStack_80._0_4_ = 0;
  uStack_80._4_1_ = false;
  uStack_80._5_3_ = 0;
  local_98.ptr_ = (string *)0x0;
  local_a8 = (Arena *)0x0;
  pAStack_a0 = (Arena *)0x0;
  pIVar3 = (((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
            (local_148._0_8_ + 8))->_M_t).
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  pcVar9 = (pointer)operator_new(0x118);
  local_148._8_8_ = &this->options_;
  *(InputFile **)pcVar9 = pIVar3;
  Options::Options((Options *)(pcVar9 + 8),(Options *)local_148._8_8_);
  pcVar9[0xe8] = '\x06';
  pcVar9[0xe9] = '\0';
  pcVar9[0xea] = '\0';
  pcVar9[0xeb] = '\0';
  pcVar9[0xf0] = '\0';
  pcVar9[0xf1] = '\0';
  pcVar9[0xf2] = '\0';
  pcVar9[0xf3] = '\0';
  pcVar9[0xf4] = '\0';
  pcVar9[0xf5] = '\0';
  pcVar9[0xf6] = '\0';
  pcVar9[0xf7] = '\0';
  pcVar9[0xf8] = '\0';
  pcVar9[0xf9] = '\0';
  pcVar9[0xfa] = '\0';
  pcVar9[0xfb] = '\0';
  pcVar9[0xfc] = '\0';
  pcVar9[0xfd] = '\0';
  pcVar9[0xfe] = '\0';
  pcVar9[0xff] = '\0';
  pcVar9[0x100] = '\0';
  pcVar9[0x101] = '\0';
  pcVar9[0x102] = '\0';
  pcVar9[0x103] = '\0';
  pcVar9[0x104] = '\0';
  pcVar9[0x105] = '\0';
  pcVar9[0x106] = '\0';
  pcVar9[0x107] = '\0';
  pcVar9[0x108] = '\0';
  pcVar9[0x109] = '\0';
  pcVar9[0x10a] = '\0';
  pcVar9[0x10b] = '\0';
  pcVar9[0x10c] = '\0';
  pcVar9[0x10d] = '\0';
  pcVar9[0x10e] = '\0';
  pcVar9[0x10f] = '\0';
  pcVar9[0x110] = '\0';
  pcVar9[0x111] = '\0';
  pcVar9[0x112] = '\0';
  pcVar9[0x113] = '\0';
  pcVar9[0x114] = '\0';
  pcVar9[0x115] = '\0';
  pcVar9[0x116] = '\0';
  pcVar9[0x117] = '\0';
  local_130._M_dataplus._M_p = pcVar9;
  std::
  vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
  ::emplace_back<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>
            ((vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
              *)&local_d8,
             (unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)&local_130);
  std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::~unique_ptr
            ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)&local_130);
  local_48.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RangeSink::AddOutput
            ((RangeSink *)
             ((Rep *)((long)local_d8.
                            super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -0x10))->elements[0],
             (DualMap *)
             ((local_c0.maps_.
               super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
             super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
             super__Head_base<0UL,_bloaty::DualMap_*,_false>,&local_48);
  local_130._M_dataplus._M_p =
       (pointer)((Rep *)((long)local_d8.
                               super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + -0x10))->elements[0];
  std::vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>>::
  emplace_back<bloaty::RangeSink*>
            ((vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>> *)&local_88,
             (RangeSink **)&local_130);
  pRVar10 = (Rep *)(this->sources_).
                   super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_f0 = (Rep *)(this->sources_).
                    super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = this;
  if (pRVar10 != local_f0) {
    do {
      pAVar12 = *(Arena **)&pRVar10->allocated_size;
      pIVar3 = (((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                (local_148._0_8_ + 8))->_M_t).
               super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>.
               _M_t.
               super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
               super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
      _Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl =
           ((local_c0.maps_.
             super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
           super__Head_base<0UL,_bloaty::DualMap_*,_false>;
      pAVar5 = (local_e8->arena_)._M_t.
               super___uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>
               .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl;
      local_100 = (Arena *)pRVar10;
      pcVar9 = (pointer)operator_new(0x118);
      DVar2 = *(DataSource *)&(pAVar12->impl_).hint_._M_b._M_p;
      *(InputFile **)pcVar9 = pIVar3;
      local_e0 = pAVar12;
      Options::Options((Options *)(pcVar9 + 8),(Options *)local_148._8_8_);
      *(DataSource *)(pcVar9 + 0xe8) = DVar2;
      *(_Head_base<0UL,_bloaty::DualMap_*,_false> *)(pcVar9 + 0xf0) =
           _Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl;
      pcVar9[0xf8] = '\0';
      pcVar9[0xf9] = '\0';
      pcVar9[0xfa] = '\0';
      pcVar9[0xfb] = '\0';
      pcVar9[0xfc] = '\0';
      pcVar9[0xfd] = '\0';
      pcVar9[0xfe] = '\0';
      pcVar9[0xff] = '\0';
      pcVar9[0x100] = '\0';
      pcVar9[0x101] = '\0';
      pcVar9[0x102] = '\0';
      pcVar9[0x103] = '\0';
      pcVar9[0x104] = '\0';
      pcVar9[0x105] = '\0';
      pcVar9[0x106] = '\0';
      pcVar9[0x107] = '\0';
      pcVar9[0x108] = '\0';
      pcVar9[0x109] = '\0';
      pcVar9[0x10a] = '\0';
      pcVar9[0x10b] = '\0';
      pcVar9[0x10c] = '\0';
      pcVar9[0x10d] = '\0';
      pcVar9[0x10e] = '\0';
      pcVar9[0x10f] = '\0';
      *(Arena **)(pcVar9 + 0x110) = pAVar5;
      local_130._M_dataplus._M_p = pcVar9;
      std::
      vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
      ::emplace_back<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>
                ((vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
                  *)&local_d8,
                 (unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)
                 &local_130);
      std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::~unique_ptr
                ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)
                 &local_130);
      pRVar6 = (RangeSink *)
               ((Rep *)((long)local_d8.
                              super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -0x10))->elements[0];
      map = DualMaps::AppendMap(&local_c0);
      pAVar12 = local_e0;
      RangeSink::AddOutput
                (pRVar6,map,
                 (((unique_ptr<bloaty::NameMunger,_std::default_delete<bloaty::NameMunger>_> *)
                  &(local_e0->impl_).space_allocated_)->_M_t).
                 super___uniq_ptr_impl<bloaty::NameMunger,_std::default_delete<bloaty::NameMunger>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bloaty::NameMunger_*,_std::default_delete<bloaty::NameMunger>_>
                 .super__Head_base<0UL,_bloaty::NameMunger_*,_false>._M_head_impl);
      if (*(DataSource *)&(pAVar12->impl_).hint_._M_b._M_p == kInputFiles) {
        local_130._M_dataplus._M_p =
             (pointer)((Rep *)((long)local_d8.
                                     super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10))->elements
                      [0];
        std::vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>>::
        emplace_back<bloaty::RangeSink*>
                  ((vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>> *)&local_a8,
                   (RangeSink **)&local_130);
      }
      else {
        local_130._M_dataplus._M_p =
             (pointer)((Rep *)((long)local_d8.
                                     super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10))->elements
                      [0];
        std::vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>>::
        emplace_back<bloaty::RangeSink*>
                  ((vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>> *)&local_88,
                   (RangeSink **)&local_130);
      }
      pRVar10 = (Rep *)((long)local_100 + 8);
    } while (pRVar10 != local_f0);
  }
  (*(*(_func_int ***)local_148._0_8_)[2])(&local_130);
  filename_00 = local_e8;
  if ((Arena *)local_130._M_string_length == (Arena *)0x0) {
    MVar16._vptr_MessageLite = (_func_int **)0x0;
    pRVar15 = local_108;
  }
  else {
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&(local_e8->debug_files_)._M_t,&local_130);
    if ((_Rb_tree_header *)cVar11._M_node ==
        &(filename_00->debug_files_)._M_t._M_impl.super__Rb_tree_header) {
      MVar16._vptr_MessageLite = (_func_int **)0x0;
    }
    else {
      GetObjectFile((Bloaty *)(local_148 + 0x10),(string *)filename_00);
      MVar16._vptr_MessageLite = (_func_int **)local_148._16_8_;
      ObjectFile::set_debug_file((ObjectFile *)local_148._0_8_,(ObjectFile *)local_148._16_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_110,&local_130);
    }
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&(filename_00->sourcemap_files_)._M_t,&local_130);
    p_Var1 = &(filename_00->sourcemap_files_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&(filename_00->sourcemap_files_)._M_t,local_70);
    }
    pRVar15 = local_108;
    if ((_Rb_tree_header *)cVar11._M_node != p_Var1) {
      (*filename_00->file_factory_->_vptr_InputFileFactory[2])
                (local_148 + 0x10,filename_00->file_factory_,cVar11._M_node + 2);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,local_130._M_dataplus._M_p,
                 local_130._M_dataplus._M_p + local_130._M_string_length);
      TryOpenSourceMapFile
                ((bloaty *)&local_f8,
                 (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                 (local_148 + 0x10),&local_68);
      pAVar12 = local_f8;
      pRVar15 = local_108;
      local_f8 = (Arena *)0x0;
      if ((ObjectFile *)MVar16._vptr_MessageLite != (ObjectFile *)0x0) {
        (**(code **)((long)*MVar16._vptr_MessageLite + 8))(MVar16._vptr_MessageLite);
      }
      if (local_f8 != (Arena *)0x0) {
        (*(code *)((local_f8->impl_).threads_._M_b._M_p)->owner_)();
      }
      local_f8 = (Arena *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      ObjectFile::set_debug_file((ObjectFile *)local_148._0_8_,(ObjectFile *)pAVar12);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_110,&local_130);
      MVar16._vptr_MessageLite = (_func_int **)pAVar12;
      if ((ObjectFile *)local_148._16_8_ != (ObjectFile *)0x0) {
        (**(code **)(*(long *)local_148._16_8_ + 0x10))();
      }
    }
  }
  local_110 = (Arena *)pRVar15->file_total_;
  local_f0 = (Rep *)pRVar15->filtered_file_total_;
  local_148._8_8_ = MVar16._vptr_MessageLite;
  (*(*(_func_int ***)local_148._0_8_)[3])(local_148._0_8_,&local_88);
  local_100 = pAStack_a0;
  pAVar12 = local_a8;
  if (local_a8 != pAStack_a0) {
    do {
      pRVar6 = (RangeSink *)(pAVar12->impl_).threads_._M_b._M_p;
      _Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl =
           ((local_c0.maps_.
             super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
           super__Head_base<0UL,_bloaty::DualMap_*,_false>;
      local_e0 = pAVar12;
      for (cVar14._M_node =
                *(_Base_ptr *)
                 ((long)_Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl + 0x18);
          (_Rb_tree_header *)cVar14._M_node !=
          (_Rb_tree_header *)
          ((long)_Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl + 8);
          cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node)) {
        uVar7 = *(uint64_t *)(cVar14._M_node + 1);
        uVar13 = RangeMap::RangeEndUnknownLimit
                           ((RangeMap *)
                            _Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl,
                            cVar14,0xffffffffffffffff);
        RangeSink::AddVMRange
                  (pRVar6,"inputfile_vmcopier",uVar7,uVar13 - *(long *)(cVar14._M_node + 1),
                   &pRVar6->file_->filename_);
      }
      _Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl =
           ((local_c0.maps_.
             super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
           super__Head_base<0UL,_bloaty::DualMap_*,_false>;
      cVar14._M_node =
           *(_Base_ptr *)
            ((long)_Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl + 0x48);
      if (cVar14._M_node !=
          (_Base_ptr)
          ((long)_Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl + 0x38)) {
        do {
          uVar7 = *(uint64_t *)(cVar14._M_node + 1);
          uVar13 = RangeMap::RangeEndUnknownLimit
                             ((RangeMap *)
                              ((long)_Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>.
                                     _M_head_impl + 0x30),cVar14,0xffffffffffffffff);
          name._M_str = (pRVar6->file_->filename_)._M_dataplus._M_p;
          name._M_len = (pRVar6->file_->filename_)._M_string_length;
          RangeSink::AddFileRange
                    (pRVar6,"inputfile_filecopier",name,uVar7,uVar13 - *(long *)(cVar14._M_node + 1)
                    );
          cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
        } while (cVar14._M_node !=
                 (_Base_ptr)
                 ((long)_Var4.super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl + 0x38));
      }
      pAVar12 = (Arena *)&(local_e0->impl_).hint_;
    } while (pAVar12 != local_100);
  }
  pRVar15 = local_108;
  DualMaps::ComputeRollup(&local_c0,local_108);
  uVar8 = local_148._8_8_;
  if ((pRVar15->file_total_ - ((long)&(local_110 + -1)[1].impl_.threads_._M_b._M_p + (long)local_f0)
      ) + pRVar15->filtered_file_total_ ==
      (((((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
         (local_148._0_8_ + 8))->_M_t).
        super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
        super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
        super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl)->data_)._M_len) {
    if ((0 < verbose_level) || ((local_e8->options_).dump_raw_map_ == true)) {
      printf("Maps for %s:\n\n",(local_70->_M_dataplus)._M_p);
      if (show != 1) {
        puts("FILE MAP:");
        DualMaps::PrintFileMaps(&local_c0);
      }
      if (show != 0) {
        puts("VM MAP:");
        DualMaps::PrintVMMaps(&local_c0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((_func_int **)uVar8 != (_func_int **)0x0) {
      (**(code **)(*(long *)uVar8 + 8))(uVar8);
    }
    std::
    vector<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_48.regexes_);
    if (local_a8 != (Arena *)0x0) {
      operator_delete(local_a8,(long)local_98.ptr_ - (long)local_a8);
    }
    if (local_88.ptr_ != (string *)0x0) {
      operator_delete(local_88.ptr_,local_78 - (long)local_88.ptr_);
    }
    std::
    vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
    ::~vector(&local_d8);
    std::
    vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
    ::~vector(&local_c0.maps_);
    if ((ObjectFile *)local_148._0_8_ != (ObjectFile *)0x0) {
      (*(*(_func_int ***)local_148._0_8_)[1])();
    }
    return;
  }
  __assert_fail("filesize == file->file_data().data().size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                0x71d,
                "void bloaty::Bloaty::ScanAndRollupFile(const std::string &, Rollup *, std::vector<std::string> *) const"
               );
}

Assistant:

void Bloaty::ScanAndRollupFile(const std::string& filename, Rollup* rollup,
                               std::vector<std::string>* out_build_ids) const {
  auto file = GetObjectFile(filename);

  DualMaps maps;
  std::vector<std::unique_ptr<RangeSink>> sinks;
  std::vector<RangeSink*> sink_ptrs;
  std::vector<RangeSink*> filename_sink_ptrs;

  // Base map always goes first.
  sinks.push_back(absl::make_unique<RangeSink>(
      &file->file_data(), options_, DataSource::kSegments, nullptr, nullptr));
  NameMunger empty_munger;
  sinks.back()->AddOutput(maps.base_map(), &empty_munger);
  sink_ptrs.push_back(sinks.back().get());

  for (auto source : sources_) {
    sinks.push_back(absl::make_unique<RangeSink>(
        &file->file_data(), options_, source->effective_source, maps.base_map(),
        arena_.get()));
    sinks.back()->AddOutput(maps.AppendMap(), source->munger.get());
    // We handle the kInputFiles data source internally, without handing it off
    // to the file format implementation.  This seems slightly simpler, since
    // the file format has to deal with armembers too.
    if (source->effective_source == DataSource::kInputFiles) {
      filename_sink_ptrs.push_back(sinks.back().get());
    } else {
      sink_ptrs.push_back(sinks.back().get());
    }
  }

  std::unique_ptr<ObjectFile> debug_file;
  std::string build_id = file->GetBuildId();
  if (!build_id.empty()) {
    auto iter = debug_files_.find(build_id);
    if (iter != debug_files_.end()) {
      debug_file = GetObjectFile(iter->second);
      file->set_debug_file(debug_file.get());
      out_build_ids->push_back(build_id);
    }

    // Maybe it's a source map file?
    auto sourcemap_iter = sourcemap_files_.find(build_id);
    // If the source map by build id isn't found, try the file name.
    if (sourcemap_iter == sourcemap_files_.end()) {
      sourcemap_iter = sourcemap_files_.find(filename);
    }
    if (sourcemap_iter != sourcemap_files_.end()) {
      std::unique_ptr<InputFile> sourcemap_file(
          file_factory_.OpenFile(sourcemap_iter->second));
      // The build id is not present in the source map file itself, so it must
      // be passed here.
      debug_file = TryOpenSourceMapFile(sourcemap_file, build_id);
      file->set_debug_file(debug_file.get());
      out_build_ids->push_back(build_id);
    }
  }

  int64_t filesize_before =
      rollup->file_total() + rollup->filtered_file_total();
  file->ProcessFile(sink_ptrs);

  // kInputFile source: Copy the base map to the filename sink(s).
  for (auto sink : filename_sink_ptrs) {
    maps.base_map()->vm_map.ForEachRange(
        [sink](uint64_t start, uint64_t length) {
          sink->AddVMRange("inputfile_vmcopier", start, length,
                           sink->input_file().filename());
        });
    maps.base_map()->file_map.ForEachRange(
        [sink](uint64_t start, uint64_t length) {
          sink->AddFileRange("inputfile_filecopier",
                             sink->input_file().filename(), start, length);
        });
  }

  maps.ComputeRollup(rollup);

  // The ObjectFile implementation must guarantee this.
  int64_t filesize =
      rollup->file_total() + rollup->filtered_file_total() - filesize_before;
  (void)filesize;
  assert(filesize == file->file_data().data().size());

  if (verbose_level > 0 || options_.dump_raw_map()) {
    printf("Maps for %s:\n\n", filename.c_str());
    if (show != ShowDomain::kShowVM) {
      printf("FILE MAP:\n");
      maps.PrintFileMaps();
    }
    if (show != ShowDomain::kShowFile) {
      printf("VM MAP:\n");
      maps.PrintVMMaps();
    }
  }
}